

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_bam.cc
# Opt level: O3

int parse_bam(int argc,char **argv)

{
  char *__s;
  int iVar1;
  htsFile *fp;
  hts_idx_t *idx;
  bam_hdr_t *hdr;
  bam1_t *b;
  size_t sVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  long lVar5;
  string seq;
  string qual;
  string region_;
  string bam;
  char *local_d0;
  long local_c8;
  char local_c0;
  undefined7 uStack_bf;
  hts_itr_t *local_b0;
  char *local_a8;
  long local_a0;
  char local_98;
  undefined7 uStack_97;
  long *local_88 [2];
  long local_78 [2];
  hts_idx_t *local_68;
  bam_hdr_t *local_60;
  htsFile *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"./parse_bam example.bam",0x17);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,argv[1],(allocator<char> *)local_88);
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,".","");
    if (argc != 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,argv[2],(allocator<char> *)&local_a8);
      std::__cxx11::string::operator=((string *)local_88,(string *)&local_d0);
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
      }
    }
    if (local_48 != 0) {
      fp = hts_open((char *)local_50,"r");
      if (fp == (htsFile *)0x0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Unable to open BAM/SAM file.");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      idx = sam_index_load(fp,(char *)local_50);
      if (idx == (hts_idx_t *)0x0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar4,"Unable to open BAM/SAM index. Make sure alignments are indexed");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      hdr = sam_hdr_read(fp);
      local_b0 = sam_itr_querys(idx,hdr,(char *)local_88[0]);
      if ((hdr == (bam_hdr_t *)0x0) || (local_b0 == (hts_itr_t *)0x0)) {
        hts_close(fp);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Unable to iterate to region within BAM.");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      b = bam_init1();
      local_68 = idx;
      local_60 = hdr;
      local_58 = fp;
      while( true ) {
        iVar1 = hts_itr_next((fp->fp).bgzf,local_b0,b,fp);
        if (iVar1 < 0) break;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Read Chr: ",10);
        __s = hdr->target_name[(b->core).tid];
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1542e0);
        }
        else {
          sVar2 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tPos: ",6);
        std::ostream::operator<<((ostream *)&std::cout,(b->core).pos);
        local_d0 = &local_c0;
        local_c8 = 0;
        local_c0 = '\0';
        local_a8 = &local_98;
        local_a0 = 0;
        local_98 = '\0';
        if (0 < (b->core).l_qseq) {
          lVar5 = 0;
          do {
            std::__cxx11::string::push_back((char)&local_d0);
            std::__cxx11::string::push_back((char)&local_a8);
            lVar5 = lVar5 + 1;
          } while (lVar5 < (b->core).l_qseq);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tSeq: ",6);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tQual: ",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_a8,local_a0);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
        idx = local_68;
        if (local_a8 != &local_98) {
          operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
        }
        fp = local_58;
        hdr = local_60;
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
        }
      }
      hts_itr_destroy(local_b0);
      hts_idx_destroy(idx);
      bam_destroy1(b);
      bam_hdr_destroy(hdr);
      hts_close(fp);
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0],local_78[0] + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  return 0;
}

Assistant:

int parse_bam(int argc, char* argv[]) {
    if(argc < 2) {
        return usage();
    }
    string bam = string(argv[1]);
    string region_ = ".";
    if(argc > 2) {
        region_ = string(argv[2]);
    }
    if(!bam.empty()) {
        //open BAM for reading
        samFile *in = sam_open(bam.c_str(), "r");
        if(in == NULL) {
            throw runtime_error("Unable to open BAM/SAM file.");
        }
        //Load the index
        hts_idx_t *idx = sam_index_load(in, bam.c_str());
        if(idx == NULL) {
            throw runtime_error("Unable to open BAM/SAM index."
                                " Make sure alignments are indexed");
        }
        //Get the header
        bam_hdr_t *header = sam_hdr_read(in);
        //Initialize iterator
        hts_itr_t *iter = NULL;
        //Move the iterator to the region we are interested in
        iter  = sam_itr_querys(idx, header, region_.c_str());
        if(header == NULL || iter == NULL) {
            sam_close(in);
            throw runtime_error("Unable to iterate to region within BAM.");
        }
        //Initiate the alignment record
        bam1_t *aln = bam_init1();
        while(sam_itr_next(in, iter, aln) >= 0) {
            cout << "Read Chr: " << header->target_name[aln->core.tid];
            cout << "\tPos: " << aln->core.pos;
            string seq, qual;
            uint8_t *quali = bam_get_qual(aln);
            uint8_t *seqi = bam_get_seq(aln);
            for (int i = 0; i < aln->core.l_qseq; i++) {
                seq += seq_nt16_str[bam_seqi(seqi, i)];
                qual += 33 + quali[i];
            }
            cout << "\tSeq: " << seq << "\tQual: " << qual;
            cout << endl;
        }
        hts_itr_destroy(iter);
        hts_idx_destroy(idx);
        bam_destroy1(aln);
        bam_hdr_destroy(header);
        sam_close(in);
    }
    return 0;
}